

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OffsetSpecsOf.hpp
# Opt level: O1

string * __thiscall
sciplot::OffsetSpecsOf<sciplot::TicsSpecs>::repr_abi_cxx11_
          (string *__return_storage_ptr__,OffsetSpecsOf<sciplot::TicsSpecs> *this)

{
  int iVar1;
  long *plVar2;
  ulong *puVar3;
  long *plVar4;
  string offset;
  stringstream ss;
  ulong *local_250;
  long local_248;
  ulong local_240;
  long lStack_238;
  long *local_230;
  long local_228;
  long local_220 [2];
  undefined1 *local_210;
  long local_208;
  undefined1 local_200;
  undefined7 uStack_1ff;
  string local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  long *local_1b0;
  long local_1a8;
  long local_1a0;
  long lStack_198;
  ios_base local_130 [264];
  
  local_208 = 0;
  local_200 = 0;
  local_210 = &local_200;
  iVar1 = std::__cxx11::string::compare((char *)&this->xoffset);
  if (iVar1 == 0) {
    iVar1 = std::__cxx11::string::compare((char *)&this->yoffset);
    if (iVar1 == 0) goto LAB_00147bbf;
  }
  std::operator+(&local_1d0,"offset ",&this->xoffset);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_1d0);
  puVar3 = (ulong *)(plVar2 + 2);
  if ((ulong *)*plVar2 == puVar3) {
    local_240 = *puVar3;
    lStack_238 = plVar2[3];
    local_250 = &local_240;
  }
  else {
    local_240 = *puVar3;
    local_250 = (ulong *)*plVar2;
  }
  local_248 = plVar2[1];
  *plVar2 = (long)puVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_250,(ulong)(this->yoffset)._M_dataplus._M_p);
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_1a0 = *plVar4;
    lStack_198 = plVar2[3];
    local_1b0 = &local_1a0;
  }
  else {
    local_1a0 = *plVar4;
    local_1b0 = (long *)*plVar2;
  }
  local_1a8 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::string::operator=((string *)&local_210,(string *)&local_1b0);
  if (local_1b0 != &local_1a0) {
    operator_delete(local_1b0,local_1a0 + 1);
  }
  if (local_250 != &local_240) {
    operator_delete(local_250,local_240 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
LAB_00147bbf:
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1b0);
  local_230 = local_220;
  std::__cxx11::string::_M_construct<char*>((string *)&local_230,local_210,local_210 + local_208);
  if (local_228 == 0) {
    local_250 = &local_240;
    local_248 = 0;
    local_240 = local_240 & 0xffffffffffffff00;
  }
  else {
    local_250 = &local_240;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_250,local_230,local_228 + (long)local_230);
    std::__cxx11::string::append((char *)&local_250);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a0,(char *)local_250,local_248);
  if (local_250 != &local_240) {
    operator_delete(local_250,local_240 + 1);
  }
  if (local_230 != local_220) {
    operator_delete(local_230,local_220[0] + 1);
  }
  std::__cxx11::stringbuf::str();
  internal::removeExtraWhitespaces(__return_storage_ptr__,&local_1f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b0);
  std::ios_base::~ios_base(local_130);
  if (local_210 != &local_200) {
    operator_delete(local_210,CONCAT71(uStack_1ff,local_200) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

auto OffsetSpecsOf<DerivedSpecs>::repr() const -> std::string
{
    std::string offset;

    if(xoffset != "0" || yoffset != "0")
        offset = "offset " + xoffset + ", " + yoffset;

    std::stringstream ss;
    ss << gnuplot::optionStr(offset);
    return internal::removeExtraWhitespaces(ss.str());
}